

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

void curl_easy_cleanup(CURL *curl)

{
  SessionHandle *data;
  CURL *curl_local;
  
  if (curl != (CURL *)0x0) {
    Curl_close((SessionHandle *)curl);
  }
  return;
}

Assistant:

void curl_easy_cleanup(CURL *curl)
{
  struct SessionHandle *data = (struct SessionHandle *)curl;
  SIGPIPE_VARIABLE(pipe_st);

  if(!data)
    return;

  sigpipe_ignore(data, &pipe_st);
  Curl_close(data);
  sigpipe_restore(&pipe_st);
}